

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timing.cpp
# Opt level: O1

void __thiscall Timing::Save(Timing *this,string *filename)

{
  undefined8 *puVar1;
  ofstream fp;
  stringstream ss;
  long local_3c8;
  long local_3c0;
  long local_3a8;
  filebuf local_3a0 [24];
  byte abStack_388 [216];
  ios_base local_2b0 [264];
  stringstream local_1a8 [16];
  ostream local_198 [376];
  
  std::ofstream::ofstream(&local_3a8,(filename->_M_dataplus)._M_p,_S_out);
  if ((abStack_388[*(long *)(local_3a8 + -0x18)] & 5) == 0) {
    Save(this,(ofstream *)&local_3a8);
    local_3a8 = _VTT;
    *(undefined8 *)(local_3a0 + *(long *)(_VTT + -0x18) + -8) = __M_insert<void_const*>;
    std::filebuf::~filebuf(local_3a0);
    std::ios_base::~ios_base(local_2b0);
    return;
  }
  std::__cxx11::stringstream::stringstream(local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_198,"Timing::Save: failed to open file ",0x22);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_198,(filename->_M_dataplus)._M_p,filename->_M_string_length);
  puVar1 = (undefined8 *)__cxa_allocate_exception(0x28);
  std::__cxx11::stringbuf::str();
  *puVar1 = &PTR__E_0059bd80;
  puVar1[1] = puVar1 + 3;
  std::__cxx11::string::_M_construct<char*>((string *)(puVar1 + 1),local_3c8,local_3c0 + local_3c8);
  __cxa_throw(puVar1,&E::typeinfo,E::~E);
}

Assistant:

void Timing::Save(const string & filename) const
{
    ofstream fp(filename.c_str());
    if(!fp)
    {
        stringstream ss;
        ss << "Timing::Save: failed to open file " << filename;
        throw(E(ss.str()));
    }

    Save(fp);
}